

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shake256_impl.c
# Opt level: O2

int shake256_squeeze(keccak_sponge *sponge,uint8_t *out,size_t outlen)

{
  int iVar1;
  
  if (out == (uint8_t *)0x0 || sponge == (keccak_sponge *)0x0) {
    return -1;
  }
  if ((long)outlen < 0) {
    iVar1 = -2;
  }
  else if (sponge->position < 0x88) {
    if (sponge->flags != 0x44a50aed67ba8c04) {
      if (sponge->flags != 0x53efb6b64647b401) {
        return 2;
      }
      _shake_pad(sponge);
      sponge->flags = 0x44a50aed67ba8c04;
    }
    _sponge_squeeze(sponge,out,outlen);
    iVar1 = 0;
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int shake256_squeeze(keccak_sponge* const __restrict sponge,
                     uint8_t* const __restrict out,
                     const size_t outlen) {
  if (sponge == NULL) {
    return SPONGERR_NULL;
  }
  if (out == NULL) {
    return SPONGERR_NULL;
  }
  if (outlen > (SIZE_MAX >> 1)) {
    return SPONGERR_RSIZE;
  }
  if (sponge->position >= sponge_rate) {
    return SPONGERR_INVARIANT;
  }

  switch (sponge->flags) {
    case (FLAG_SQUEEZING):
      break;
    case (FLAG_ABSORBING):
      // If we're still absorbing, pad the message and apply Keccak-f.
      _shake_pad(sponge);
      sponge->flags = FLAG_SQUEEZING;
      break;
    default:
      // The sponge hasn't been initialized.
      return SPONGERR_NOTINIT;
  }

  _sponge_squeeze(sponge, out, outlen);

  return 0;
}